

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O1

void __thiscall
cfd::core::Serializer::AddPrefixBuffer
          (Serializer *this,uint64_t prefix,uint8_t *buffer,uint32_t buffer_size)

{
  int iVar1;
  
  iVar1 = 1;
  if ((0xfc < prefix) && (iVar1 = 3, 0xffff < prefix)) {
    iVar1 = (uint)(prefix >> 0x20 != 0) * 4 + 5;
  }
  AddVariableInt(this,(ulong)(iVar1 + buffer_size));
  AddVariableInt(this,prefix);
  if (buffer_size != 0 && buffer != (uint8_t *)0x0) {
    CheckNeedSize(this,buffer_size);
    memcpy((this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start + this->offset_,buffer,(ulong)buffer_size);
    this->offset_ = this->offset_ + buffer_size;
  }
  return;
}

Assistant:

void Serializer::AddPrefixBuffer(
    uint64_t prefix, const uint8_t* buffer, uint32_t buffer_size) {
  uint32_t size = GetVariableIntSize(prefix) + buffer_size;
  AddVariableInt(size);
  AddVariableInt(prefix);
  AddDirectBytes(buffer, buffer_size);
}